

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::on_disk_read_complete
          (peer_connection *this,disk_buffer_holder *buffer,storage_error *error,peer_request *r,
          time_point issue_time)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  error_category *peVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  undefined4 extraout_var;
  alert_manager *paVar9;
  shared_ptr<libtorrent::aux::torrent> t;
  undefined1 local_78 [16];
  string local_68;
  disk_buffer_holder local_48;
  
  lVar8 = ::std::chrono::_V2::system_clock::now();
  lVar8 = (lVar8 - (long)issue_time.__d.__r) / 1000;
  iVar7 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
            _vptr_session_logger[5])();
  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar7) + 0x68) < 0) {
    uVar1 = (r->piece).m_val;
    uVar2 = r->start;
    uVar3 = r->length;
    pcVar4 = buffer->m_buf;
    peVar5 = (error->ec).cat_;
    (*peVar5->_vptr_error_category[4])
              ((string *)(local_78 + 0x10),peVar5,(ulong)(uint)(error->ec).val_);
    peer_log(this,info,"FILE_ASYNC_READ_COMPLETE","piece: %d s: %x l: %x b: %p e: %s rtt: %d us",
             (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,pcVar4,local_68._M_dataplus._M_p,lVar8);
    ::std::__cxx11::string::~string((string *)(local_78 + 0x10));
  }
  this->m_reading_bytes = this->m_reading_bytes - r->length;
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_peer_connection_hot_members).m_torrent);
  if ((error->ec).val_ == 0) {
    this->m_disk_read_failures = '\0';
    if ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) &&
       (iVar7 = session_settings::get_int
                          ((this->super_peer_connection_hot_members).m_settings,0x4019), iVar7 == 1)
       ) {
      torrent::add_suggest_piece
                (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (piece_index_t)(r->piece).m_val);
    }
    if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_0022a5a8;
    if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peer_log(this,outgoing_message,"PIECE","piece: %d s: %x l: %x",(ulong)(uint)(r->piece).m_val,
               (ulong)(uint)r->start,(ulong)(uint)r->length);
      counters::blend_stats_counter(this->m_counters,0xf2,(long)(int)lVar8,5);
      iVar7 = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x4019)
      ;
      if (iVar7 == 1) {
        torrent::add_suggest_piece
                  (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,(piece_index_t)(r->piece).m_val);
      }
      disk_buffer_holder::disk_buffer_holder(&local_48,buffer);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x28])(this,r,&local_48);
      disk_buffer_holder::~disk_buffer_holder(&local_48);
      goto LAB_0022a5a8;
    }
  }
  else if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0) {
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x26])
              (this,(ulong)(uint)(r->piece).m_val);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
    paVar9 = torrent::alerts(t.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    if (((paVar9->m_alert_mask)._M_i.m_val & 0x49) != 0) {
      paVar9 = torrent::alerts(t.
                               super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      torrent::resolve_filename_abi_cxx11_
                ((string *)(local_78 + 0x10),
                 t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (file_index_t)(int)*(int3 *)&error->field_0x10);
      torrent::get_handle((torrent *)local_78);
      alert_manager::
      emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                (paVar9,&error->ec,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x10),&error->operation,(torrent_handle *)local_78);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      ::std::__cxx11::string::~string((string *)(local_78 + 0x10));
    }
    bVar6 = this->m_disk_read_failures + 1;
    this->m_disk_read_failures = bVar6;
    if (bVar6 < 0x65) goto LAB_0022a5a8;
  }
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,error,8,0);
LAB_0022a5a8:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void peer_connection::on_disk_read_complete(disk_buffer_holder buffer
		, storage_error const& error
		, peer_request const& r, time_point const issue_time)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(r.length >= 0);

		// return value:
		// 0: success, piece passed hash check
		// -1: disk failure

		int const disk_rtt = int(total_microseconds(clock_type::now() - issue_time));

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "FILE_ASYNC_READ_COMPLETE"
				, "piece: %d s: %x l: %x b: %p e: %s rtt: %d us"
				, static_cast<int>(r.piece), r.start, r.length
				, static_cast<void*>(buffer.data())
				, error.ec.message().c_str(), disk_rtt);
		}
#endif

		m_reading_bytes -= r.length;

		auto t = m_torrent.lock();
		if (error)
		{
			if (!t)
			{
				disconnect(error.ec, operation_t::file_read);
				return;
			}

			write_dont_have(r.piece);
			write_reject_request(r);
			if (t->alerts().should_post<file_error_alert>())
				t->alerts().emplace_alert<file_error_alert>(error.ec
					, t->resolve_filename(error.file())
					, error.operation, t->get_handle());

			++m_disk_read_failures;
			if (m_disk_read_failures > 100) disconnect(error.ec, operation_t::file_read);
			return;
		}

		// we're only interested in failures in a row.
		// if we every now and then successfully send a
		// block, the peer is still useful
		m_disk_read_failures = 0;

		if (t && m_settings.get_int(settings_pack::suggest_mode)
			== settings_pack::suggest_read_cache)
		{
			// tell the torrent that we just read a block from this piece.
			// if this piece is low-availability, it's now a candidate for being
			// suggested to other peers
			t->add_suggest_piece(r.piece);
		}

		if (m_disconnecting) return;

		if (!t)
		{
			disconnect(error.ec, operation_t::file_read);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message
			, "PIECE", "piece: %d s: %x l: %x"
			, static_cast<int>(r.piece), r.start, r.length);
#endif

		m_counters.blend_stats_counter(counters::request_latency, disk_rtt, 5);

		// we probably just pulled this piece into the cache.
		// if it's rare enough to make it into the suggested piece
		// push another piece out
		if (m_settings.get_int(settings_pack::suggest_mode) == settings_pack::suggest_read_cache)
		{
			t->add_suggest_piece(r.piece);
		}
		write_piece(r, std::move(buffer));
	}